

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_ctx_cancel_send(nni_aio *aio,void *arg,int rv)

{
  long lVar1;
  req0_sock *s;
  req0_ctx *ctx;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x358));
  if (*(nni_aio **)((long)arg + 0x58) == aio) {
    if (*(long *)((long)arg + 0x50) != 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req.c"
                ,0x2a1,"ctx->recv_aio == NULL");
    }
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_aio_set_msg(aio,*(nni_msg **)((long)arg + 0x60));
    nni_msg_header_clear(*(nni_msg **)((long)arg + 0x60));
    *(undefined8 *)((long)arg + 0x60) = 0;
    req0_ctx_reset((req0_ctx *)arg);
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x358));
  return;
}

Assistant:

static void
req0_ctx_cancel_send(nni_aio *aio, void *arg, int rv)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;

	nni_mtx_lock(&s->mtx);
	if (ctx->send_aio == aio) {
		// There should not be a pending reply, because we canceled
		// it while we were waiting.
		NNI_ASSERT(ctx->recv_aio == NULL);
		ctx->send_aio = NULL;
		// Restore the message back to the aio.
		nni_aio_set_msg(aio, ctx->req_msg);
		nni_msg_header_clear(ctx->req_msg);
		ctx->req_msg = NULL;

		// Cancellation of a pending receive is treated as aborting the
		// entire state machine.  This allows us to preserve the
		// semantic of exactly one receive operation per send
		// operation, and should be the least surprising for users. The
		// main consequence is that if a receive operation is completed
		// (in error or otherwise), the user must submit a new send
		// operation to restart the state machine.
		req0_ctx_reset(ctx);

		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&s->mtx);
}